

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

bool pbrt::IsAbsolutePath(string *filename)

{
  byte bVar1;
  string *in_stack_ffffffffffffffc8;
  path *in_stack_ffffffffffffffd0;
  bool local_1;
  
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    filesystem::path::path(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_1 = filesystem::path::is_absolute((path *)&stack0xffffffffffffffc8);
    filesystem::path::~path((path *)0x545478);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool IsAbsolutePath(const std::string &filename) {
    if (filename.empty())
        return false;
    return filesystem::path(filename).is_absolute();
}